

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::optionChangeAction(Highs *this)

{
  HighsModel *this_00;
  double *pdVar1;
  uint uVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  HighsInt iCol;
  long lVar9;
  ulong uVar10;
  HighsStatus HVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  
  this_00 = &this->model_;
  bVar5 = HighsLp::isMip(&this_00->lp_);
  iVar12 = (this->options_).super_HighsOptionsStruct.user_bound_scale;
  bVar6 = false;
  dVar13 = 1.0;
  if (iVar12 == (this->model_).lp_.user_bound_scale_) {
    iVar12 = 0;
  }
  else {
    bVar6 = HighsLp::userBoundScaleOk
                      (&this_00->lp_,iVar12,(this->options_).super_HighsOptionsStruct.infinite_bound
                      );
    if (bVar6) {
      iVar12 = (this->options_).super_HighsOptionsStruct.user_bound_scale -
               (this->model_).lp_.user_bound_scale_;
      dVar13 = ldexp(1.0,iVar12);
      bVar6 = false;
    }
    else {
      (this->options_).super_HighsOptionsStruct.user_bound_scale =
           (this->model_).lp_.user_bound_scale_;
      iVar12 = 0;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "New user bound scaling yields infinite bound: reverting user bound scaling to %d\n"
                  );
      bVar6 = true;
      dVar13 = 1.0;
    }
  }
  dVar14 = (this->info_).super_HighsInfoStruct.max_primal_infeasibility * dVar13;
  pdVar1 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
  if (dVar14 < *pdVar1 || dVar14 == *pdVar1) {
    if (bVar5) goto LAB_002554be;
    if ((this->info_).super_HighsInfoStruct.primal_solution_status == 1) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Option change leads to gain of primal feasibility\n");
      (this->info_).super_HighsInfoStruct.primal_solution_status = 2;
      (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = 0;
    }
LAB_0025554c:
    if (iVar12 != 0) goto LAB_00255555;
  }
  else {
    if ((1.0 < dVar13) && ((this->info_).super_HighsInfoStruct.num_primal_infeasibilities == 0)) {
      this->model_status_ = kMin;
      if ((this->info_).super_HighsInfoStruct.primal_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of primal feasibility\n");
      }
      (this->info_).super_HighsInfoStruct.primal_solution_status = 1;
      (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
    }
LAB_002554be:
    if (!bVar5 || iVar12 == 0) goto LAB_0025554c;
    this->model_status_ = kMin;
    if (iVar12 < 0) {
      if ((this->info_).super_HighsInfoStruct.primal_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of primal feasibility for MIP\n");
      }
      (this->info_).super_HighsInfoStruct.primal_solution_status = 1;
    }
LAB_00255555:
    (this->info_).super_HighsInfoStruct.objective_function_value =
         (this->info_).super_HighsInfoStruct.objective_function_value * dVar13;
    dVar14 = (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities;
    (this->info_).super_HighsInfoStruct.max_primal_infeasibility =
         dVar13 * (this->info_).super_HighsInfoStruct.max_primal_infeasibility;
    (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = dVar13 * dVar14;
    iVar12 = (this->model_).lp_.num_col_;
    pdVar3 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < iVar12; lVar9 = lVar9 + 1) {
      pdVar3[lVar9] = pdVar3[lVar9] * dVar13;
    }
    uVar2 = (this->model_).lp_.num_row_;
    pdVar3 = (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar10;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      pdVar3[uVar10] = pdVar3[uVar10] * dVar13;
    }
    HighsLp::userBoundScale
              (&this_00->lp_,(this->options_).super_HighsOptionsStruct.user_bound_scale);
  }
  iVar12 = (this->options_).super_HighsOptionsStruct.user_cost_scale;
  dVar13 = 1.0;
  if (iVar12 == (this->model_).lp_.user_cost_scale_) {
    bVar7 = true;
LAB_0025563d:
    bVar4 = false;
  }
  else {
    bVar7 = HighsModel::userCostScaleOk
                      (this_00,iVar12,(this->options_).super_HighsOptionsStruct.small_matrix_value,
                       (this->options_).super_HighsOptionsStruct.large_matrix_value,
                       (this->options_).super_HighsOptionsStruct.infinite_cost);
    if (bVar7) {
      iVar12 = (this->options_).super_HighsOptionsStruct.user_cost_scale -
               (this->model_).lp_.user_cost_scale_;
      bVar7 = iVar12 == 0;
      dVar13 = ldexp(1.0,iVar12);
      goto LAB_0025563d;
    }
    (this->options_).super_HighsOptionsStruct.user_cost_scale = (this->model_).lp_.user_cost_scale_;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "New user cost scaling yields excessive cost coefficient: reverting user cost scaling to %d\n"
                );
    bVar4 = true;
    bVar7 = true;
    dVar13 = 1.0;
  }
  if (bVar5) {
    if (bVar7) goto LAB_002557d5;
    this->model_status_ = kMin;
  }
  else {
    dVar14 = (this->info_).super_HighsInfoStruct.max_dual_infeasibility * dVar13;
    pdVar1 = &(this->options_).super_HighsOptionsStruct.dual_feasibility_tolerance;
    if (dVar14 < *pdVar1 || dVar14 == *pdVar1) {
      if ((this->info_).super_HighsInfoStruct.dual_solution_status == 1) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to gain of dual feasibility\n");
        (this->info_).super_HighsInfoStruct.dual_solution_status = 2;
        (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = 0;
      }
    }
    else if ((1.0 < dVar13) && ((this->info_).super_HighsInfoStruct.num_dual_infeasibilities == 0))
    {
      this->model_status_ = kMin;
      if ((this->info_).super_HighsInfoStruct.dual_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of dual feasibility\n");
        (this->info_).super_HighsInfoStruct.dual_solution_status = 1;
      }
      (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
    }
    if (bVar7) goto LAB_002557d5;
  }
  (this->info_).super_HighsInfoStruct.objective_function_value =
       (this->info_).super_HighsInfoStruct.objective_function_value * dVar13;
  dVar14 = (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities;
  (this->info_).super_HighsInfoStruct.max_dual_infeasibility =
       dVar13 * (this->info_).super_HighsInfoStruct.max_dual_infeasibility;
  (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = dVar13 * dVar14;
  iVar12 = (this->model_).lp_.num_col_;
  pdVar3 = (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = 0; lVar9 < iVar12; lVar9 = lVar9 + 1) {
    pdVar3[lVar9] = pdVar3[lVar9] * dVar13;
  }
  uVar2 = (this->model_).lp_.num_row_;
  pdVar3 = (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar10;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    pdVar3[uVar10] = pdVar3[uVar10] * dVar13;
  }
  HighsModel::userCostScale(this_00,(this->options_).super_HighsOptionsStruct.user_cost_scale);
LAB_002557d5:
  if (((this->model_status_ != kOptimal) &&
      ((this->info_).super_HighsInfoStruct.primal_solution_status == 2)) &&
     ((this->info_).super_HighsInfoStruct.dual_solution_status == 2)) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "Option change leads to gain of optimality\n");
    this->model_status_ = kOptimal;
  }
  if (bVar6 || bVar4) {
    HVar11 = kError;
  }
  else {
    HVar11 = kOk;
    if (((this->iis_).valid_ == true) &&
       (HVar11 = kOk,
       (this->options_).super_HighsOptionsStruct.iis_strategy != (this->iis_).strategy_)) {
      HighsIis::invalidate(&this->iis_);
    }
  }
  return HVar11;
}

Assistant:

HighsStatus Highs::optionChangeAction() {
  HighsModel& model = this->model_;
  HighsLp& lp = model.lp_;
  HighsInfo& info = this->info_;
  HighsOptions& options = this->options_;
  const bool is_mip = lp.isMip();
  HighsInt dl_user_bound_scale = 0;
  double dl_user_bound_scale_value = 1;
  // Ensure that user bound scaling does not yield infinite bounds
  const bool changed_user_bound_scale =
      options.user_bound_scale != lp.user_bound_scale_;
  bool user_bound_scale_ok =
      !changed_user_bound_scale ||
      lp.userBoundScaleOk(options.user_bound_scale, options.infinite_bound);
  if (!user_bound_scale_ok) {
    options.user_bound_scale = lp.user_bound_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user bound scaling yields infinite bound: reverting user "
                 "bound scaling to %d\n",
                 int(options.user_bound_scale));
  } else if (changed_user_bound_scale) {
    dl_user_bound_scale = options.user_bound_scale - lp.user_bound_scale_;
    dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  }
  // Now consider impact on primal feasibility of user bound scaling
  // and/or primal_feasibility_tolerance change.
  //
  double new_max_primal_infeasibility =
      info.max_primal_infeasibility * dl_user_bound_scale_value;
  if (new_max_primal_infeasibility > options.primal_feasibility_tolerance) {
    // Not primal feasible: only act if the model is currently primal
    // feasible or dl_user_bound_scale_value > 1
    if (info.num_primal_infeasibilities == 0 && dl_user_bound_scale_value > 1) {
      this->model_status_ = HighsModelStatus::kNotset;
      if (info.primal_solution_status == kSolutionStatusFeasible)
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Option change leads to loss of primal feasibility\n");
      info.primal_solution_status = kSolutionStatusInfeasible;
      info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
    }
  } else if (!is_mip &&
             info.primal_solution_status == kSolutionStatusInfeasible) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Option change leads to gain of primal feasibility\n");
    info.primal_solution_status = kSolutionStatusFeasible;
    info.num_primal_infeasibilities = 0;
  }
  if (is_mip && dl_user_bound_scale) {
    // MIP with non-trivial bound scaling loses optimality
    this->model_status_ = HighsModelStatus::kNotset;
    if (dl_user_bound_scale < 0) {
      // MIP with negative bound scaling exponent loses feasibility
      if (info.primal_solution_status == kSolutionStatusFeasible) {
        highsLogUser(
            options_.log_options, HighsLogType::kInfo,
            "Option change leads to loss of primal feasibility for MIP\n");
      }
      info.primal_solution_status = kSolutionStatusInfeasible;
    }
  }
  if (dl_user_bound_scale) {
    // Update info and solution with respect to non-trivial user bound
    // scaling
    //
    // max and sum of infeasibilities scales: num is handled later
    info.objective_function_value *= dl_user_bound_scale_value;
    info.max_primal_infeasibility *= dl_user_bound_scale_value;
    info.sum_primal_infeasibilities *= dl_user_bound_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_value[iCol] *= dl_user_bound_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_value[iRow] *= dl_user_bound_scale_value;
    // Update LP with respect to non-trivial user bound scaling
    lp.userBoundScale(options_.user_bound_scale);
  }
  // Now consider whether options.user_cost_scale has changed
  HighsInt dl_user_cost_scale = 0;
  double dl_user_cost_scale_value = 1;
  const bool changed_user_cost_scale =
      options.user_cost_scale != lp.user_cost_scale_;
  bool user_cost_scale_ok =
      !changed_user_cost_scale ||
      model.userCostScaleOk(options.user_cost_scale, options.small_matrix_value,
                            options.large_matrix_value, options.infinite_cost);
  if (!user_cost_scale_ok) {
    options.user_cost_scale = lp.user_cost_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user cost scaling yields excessive cost coefficient: "
                 "reverting user cost scaling to %d\n",
                 int(options.user_cost_scale));
  } else if (changed_user_cost_scale) {
    dl_user_cost_scale = options.user_cost_scale - lp.user_cost_scale_;
    dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  }
  if (!is_mip) {
    // Now consider impact on dual feasibility of user cost scaling
    // and/or dual_feasibility_tolerance change
    double new_max_dual_infeasibility =
        info.max_dual_infeasibility * dl_user_cost_scale_value;
    if (new_max_dual_infeasibility > options.dual_feasibility_tolerance) {
      // Not dual feasible: only act if the model is currently dual
      // feasible or dl_user_bound_scale_value > 1
      if (info.num_dual_infeasibilities == 0 && dl_user_cost_scale_value > 1) {
        this->model_status_ = HighsModelStatus::kNotset;
        if (info.dual_solution_status == kSolutionStatusFeasible) {
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "Option change leads to loss of dual feasibility\n");
          info.dual_solution_status = kSolutionStatusInfeasible;
        }
        info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
      }
    } else if (info.dual_solution_status == kSolutionStatusInfeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of dual feasibility\n");
      info.dual_solution_status = kSolutionStatusFeasible;
      info.num_dual_infeasibilities = 0;
    }
  }
  if (dl_user_cost_scale) {
    if (is_mip) {
      // MIP with non-trivial cost scaling loses optimality
      this->model_status_ = HighsModelStatus::kNotset;
    }
    // Now update data and solution with respect to non-trivial user
    // cost scaling
    //
    // max and sum of infeasibilities scales: num is handled earlier
    info.objective_function_value *= dl_user_cost_scale_value;
    info.max_dual_infeasibility *= dl_user_cost_scale_value;
    info.sum_dual_infeasibilities *= dl_user_cost_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_dual[iCol] *= dl_user_cost_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_dual[iRow] *= dl_user_cost_scale_value;
    model.userCostScale(options.user_cost_scale);
  }
  if (this->model_status_ != HighsModelStatus::kOptimal) {
    if (info.primal_solution_status == kSolutionStatusFeasible &&
        info.dual_solution_status == kSolutionStatusFeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of optimality\n");
      this->model_status_ = HighsModelStatus::kOptimal;
    }
  }
  if (!user_bound_scale_ok || !user_cost_scale_ok) return HighsStatus::kError;
  if (this->iis_.valid_ && options_.iis_strategy != this->iis_.strategy_)
    this->iis_.invalidate();
  return HighsStatus::kOk;
}